

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureSocket.cpp
# Opt level: O0

bool __thiscall Jupiter::SecureSocket::initSSL(SecureSocket *this)

{
  SSL_CTX *context;
  bool bVar1;
  SocketType fd;
  int iVar2;
  SSL_METHOD *pSVar3;
  SSL_CTX *pSVar4;
  char *pcVar5;
  char *key;
  SSL *pSVar6;
  long lVar7;
  int t;
  SecureSocket *this_local;
  
  OPENSSL_init_ssl(0x200002,0);
  OPENSSL_init_ssl(0);
  if (this->m_ssl_data->context == (SSL_CTX *)0x0) {
    if (this->m_ssl_data->method == (SSL_METHOD *)0x0) {
      pSVar3 = (SSL_METHOD *)TLS_method();
      this->m_ssl_data->method = pSVar3;
      if (this->m_ssl_data->method == (SSL_METHOD *)0x0) {
        return false;
      }
    }
    pSVar4 = SSL_CTX_new((SSL_METHOD *)this->m_ssl_data->method);
    this->m_ssl_data->context = (SSL_CTX *)pSVar4;
    if (this->m_ssl_data->context == (SSL_CTX *)0x0) {
      ERR_print_errors_fp(_stderr);
      return false;
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&this->m_ssl_data->cert);
    if (!bVar1) {
      context = this->m_ssl_data->context;
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&this->m_ssl_data->cert);
      key = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      (&this->m_ssl_data->key);
      loadCertificate(context,pcVar5,key);
    }
  }
  pSVar6 = SSL_new((SSL_CTX *)this->m_ssl_data->context);
  this->m_ssl_data->handle = (SSL *)pSVar6;
  if (this->m_ssl_data->handle == (SSL *)0x0) {
    ERR_print_errors_fp(_stderr);
    this_local._7_1_ = false;
  }
  else {
    pSVar6 = (SSL *)this->m_ssl_data->handle;
    fd = Socket::getDescriptor(&this->super_Socket);
    iVar2 = SSL_set_fd(pSVar6,fd);
    if (iVar2 == 0) {
      ERR_print_errors_fp(_stderr);
      this_local._7_1_ = false;
    }
    else {
      pSVar6 = (SSL *)this->m_ssl_data->handle;
      pcVar5 = Socket::getRemoteHostnameC(&this->super_Socket);
      lVar7 = SSL_ctrl(pSVar6,0x37,0,pcVar5);
      if (lVar7 == 1) {
        iVar2 = SSL_connect((SSL *)this->m_ssl_data->handle);
        if (iVar2 == 1) {
          this_local._7_1_ = true;
        }
        else {
          ERR_print_errors_fp(_stderr);
          this_local._7_1_ = false;
        }
      }
      else {
        ERR_print_errors_fp(_stderr);
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Jupiter::SecureSocket::initSSL() {
	SSL_load_error_strings();
	SSL_library_init();

	if (m_ssl_data->context == nullptr) {
		if (m_ssl_data->method == nullptr) {
			m_ssl_data->method = TLS_method();
			if (m_ssl_data->method == nullptr)
				return false;
		}

		m_ssl_data->context = SSL_CTX_new(m_ssl_data->method);
		if (m_ssl_data->context == nullptr) {
			ERR_print_errors_fp(stderr);
			return false;
		}
		if (!m_ssl_data->cert.empty()) {
			loadCertificate(m_ssl_data->context, m_ssl_data->cert.c_str(), m_ssl_data->key.c_str());
		}
	}

	m_ssl_data->handle = SSL_new(m_ssl_data->context);
	if (m_ssl_data->handle == nullptr) {
		ERR_print_errors_fp(stderr);
		return false;
	}

	// Not suppressing this warning; descriptor ideally shouldn't be getting shortened here, even if it's "safe"
	// TODO: Can't resolve this without removing OpenSSL usage on Windows; we should ideally use Windows APIs
	if (SSL_set_fd(m_ssl_data->handle, this->getDescriptor()) == 0) {
		ERR_print_errors_fp(stderr);
		return false;
	}
	if (SSL_set_tlsext_host_name(m_ssl_data->handle, this->getRemoteHostnameC()) != 1) {
		// This error check is potentially redundant, but no documentation has been found.
		ERR_print_errors_fp(stderr);
		return false;
	}
	int t = SSL_connect(m_ssl_data->handle);
	if (t != 1)
	{
		ERR_print_errors_fp(stderr);
		return false;
	}
	return true;
}